

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

void class_destroy(klass cls)

{
  int iVar1;
  uintmax_t uVar2;
  long *in_RDI;
  char *local_20;
  klass in_stack_ffffffffffffffe8;
  klass in_stack_fffffffffffffff0;
  
  if (in_RDI != (long *)0x0) {
    iVar1 = class_decrement_reference(in_stack_ffffffffffffffe8);
    if (iVar1 != 0) {
      if (*in_RDI == 0) {
        local_20 = "<anonymous>";
      }
      else {
        local_20 = (char *)*in_RDI;
      }
      log_write_impl_va("metacall",0x34b,"class_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,3,"Invalid reference counter in class: %s",local_20);
    }
    uVar2 = threading_atomic_ref_count_load((threading_atomic_ref_count)(in_RDI + 4));
    if (uVar2 == 0) {
      class_constructors_destroy(in_stack_fffffffffffffff0);
      set_iterate(in_RDI[8],class_attributes_destroy_cb_iterate,0);
      set_iterate(in_RDI[9],class_attributes_destroy_cb_iterate,0);
      map_iterate(in_RDI[6],class_methods_destroy_cb_iterate,0);
      map_iterate(in_RDI[7],class_methods_destroy_cb_iterate,0);
      if ((in_RDI[3] != 0) && (*(long *)(in_RDI[3] + 0x30) != 0)) {
        (**(code **)(in_RDI[3] + 0x30))(in_RDI,in_RDI[2]);
      }
      if (*in_RDI != 0) {
        free((void *)*in_RDI);
      }
      if (in_RDI[5] != 0) {
        vector_destroy(in_RDI[5]);
      }
      if (in_RDI[6] != 0) {
        map_destroy(in_RDI[6]);
      }
      if (in_RDI[7] != 0) {
        map_destroy(in_RDI[7]);
      }
      if (in_RDI[8] != 0) {
        set_destroy(in_RDI[8]);
      }
      if (in_RDI[9] != 0) {
        set_destroy(in_RDI[9]);
      }
      threading_atomic_ref_count_destroy((threading_atomic_ref_count)(in_RDI + 4));
      free(in_RDI);
      LOCK();
      class_stats.deallocations = class_stats.deallocations + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void class_destroy(klass cls)
{
	if (cls != NULL)
	{
		if (class_decrement_reference(cls) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid reference counter in class: %s", cls->name ? cls->name : "<anonymous>");
		}

		if (threading_atomic_ref_count_load(&cls->ref) == 0)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			if (cls->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous class <%p>", (void *)cls);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy class %s <%p>", cls->name, (void *)cls);
			}
			*/

			class_constructors_destroy(cls);

			set_iterate(cls->attributes, &class_attributes_destroy_cb_iterate, NULL);
			set_iterate(cls->static_attributes, &class_attributes_destroy_cb_iterate, NULL);

			map_iterate(cls->methods, &class_methods_destroy_cb_iterate, NULL);
			map_iterate(cls->static_methods, &class_methods_destroy_cb_iterate, NULL);

			if (cls->interface != NULL && cls->interface->destroy != NULL)
			{
				cls->interface->destroy(cls, cls->impl);
			}

			if (cls->name != NULL)
			{
				free(cls->name);
			}

			if (cls->constructors != NULL)
			{
				vector_destroy(cls->constructors);
			}

			if (cls->methods != NULL)
			{
				map_destroy(cls->methods);
			}

			if (cls->static_methods != NULL)
			{
				map_destroy(cls->static_methods);
			}

			if (cls->attributes != NULL)
			{
				set_destroy(cls->attributes);
			}

			if (cls->static_attributes != NULL)
			{
				set_destroy(cls->static_attributes);
			}

			threading_atomic_ref_count_destroy(&cls->ref);

			free(cls);

			reflect_memory_tracker_deallocation(class_stats);
		}
	}
}